

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O0

bool mg::data::mzp_read(string *data,Mzp *out)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  MzpArchiveHeader *pMVar4;
  undefined8 *puVar5;
  uint32_t local_64;
  char *local_60;
  reference local_58;
  MzpArchiveEntry *entry_1;
  iterator __end2;
  iterator __begin2;
  vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_> *__range2;
  MzpArchiveEntry entry;
  size_type archive_header_offset;
  uint16_t i;
  Mzp *out_local;
  string *data_local;
  
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 8) {
    data_local._7_1_ = false;
  }
  else {
    pMVar4 = (MzpArchiveHeader *)std::__cxx11::string::operator[]((ulong)data);
    out->header = *pMVar4;
    Mzp::MzpArchiveHeader::to_host_order(&out->header);
    iVar2 = memcmp(out,"mrgd00",6);
    if (iVar2 == 0) {
      std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
      clear(&out->entry_headers);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&out->entry_data);
      for (archive_header_offset._6_2_ = 0;
          archive_header_offset._6_2_ < (out->header).archive_entry_count;
          archive_header_offset._6_2_ = archive_header_offset._6_2_ + 1) {
        entry = (MzpArchiveEntry)((ulong)archive_header_offset._6_2_ * 8 + 8);
        puVar5 = (undefined8 *)std::__cxx11::string::operator[]((ulong)data);
        __range2 = (vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    *)*puVar5;
        Mzp::MzpArchiveEntry::to_host_order((MzpArchiveEntry *)&__range2);
        std::vector<mg::data::Mzp::MzpArchiveEntry,std::allocator<mg::data::Mzp::MzpArchiveEntry>>::
        emplace_back<mg::data::Mzp::MzpArchiveEntry&>
                  ((vector<mg::data::Mzp::MzpArchiveEntry,std::allocator<mg::data::Mzp::MzpArchiveEntry>>
                    *)&out->entry_headers,(MzpArchiveEntry *)&__range2);
      }
      __end2 = std::
               vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
               ::begin(&out->entry_headers);
      entry_1 = (MzpArchiveEntry *)
                std::
                vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ::end(&out->entry_headers);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<mg::data::Mzp::MzpArchiveEntry_*,_std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>_>
                                    *)&entry_1);
        if (!bVar1) break;
        local_58 = __gnu_cxx::
                   __normal_iterator<mg::data::Mzp::MzpArchiveEntry_*,_std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>_>
                   ::operator*(&__end2);
        Mzp::archive_entry_start_offset(out,local_58);
        local_60 = (char *)std::__cxx11::string::operator[]((ulong)data);
        local_64 = Mzp::MzpArchiveEntry::entry_data_size(local_58);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*,unsigned_int>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &out->entry_data,&local_60,&local_64);
        __gnu_cxx::
        __normal_iterator<mg::data::Mzp::MzpArchiveEntry_*,_std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>_>
        ::operator++(&__end2);
      }
      data_local._7_1_ = true;
    }
    else {
      data_local._7_1_ = false;
    }
  }
  return data_local._7_1_;
}

Assistant:

bool mzp_read(const std::string &data, Mzp &out) {
  // Is file large enough to have a header
  if (data.size() < sizeof(Mzp::MzpArchiveHeader)) {
    return false;
  }

  // Read off header
  out.header = *reinterpret_cast<const Mzp::MzpArchiveHeader *>(&data[0]);
  out.header.to_host_order();

  // Valid magic?
  if (memcmp(out.header.magic, Mzp::FILE_MAGIC,
             sizeof(Mzp::MzpArchiveHeader::magic)) != 0) {
    return false;
  }

  // Clear output vecs
  out.entry_headers.clear();
  out.entry_data.clear();

  // Iterate the archive entries
  for (uint16_t i = 0; i < out.header.archive_entry_count; i++) {
    // Calculate start offset of header record
    std::string::size_type archive_header_offset =
        sizeof(Mzp::MzpArchiveHeader) + sizeof(Mzp::MzpArchiveEntry) * i;

    // Clone data
    Mzp::MzpArchiveEntry entry =
        *reinterpret_cast<const Mzp::MzpArchiveEntry *>(
            &data[archive_header_offset]);
    entry.to_host_order();

    // Add to header
    out.entry_headers.emplace_back(entry);
  }

  // Scan through and extract the actual archive data
  for (auto &entry : out.entry_headers) {
    out.entry_data.emplace_back(&data[out.archive_entry_start_offset(entry)],
                                entry.entry_data_size());
  }

  return true;
}